

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

bool __thiscall TURBOLINECOUNT::CLineCount::createThread(CLineCount *this,int thread_number)

{
  int iVar1;
  reference pvVar2;
  value_type vStack_30;
  int ret;
  pthread_t hThread;
  LCTHREADCONTEXT *ctx;
  CLineCount *pCStack_18;
  int thread_number_local;
  CLineCount *this_local;
  
  ctx._4_4_ = thread_number;
  pCStack_18 = this;
  hThread = (pthread_t)operator_new(0x10);
  *(CLineCount **)(hThread + 8) = this;
  *(int *)hThread = ctx._4_4_;
  iVar1 = pthread_create(&stack0xffffffffffffffd0,(pthread_attr_t *)0x0,threadProc,(void *)hThread);
  if (iVar1 == 0) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_threads,(long)ctx._4_4_);
    *pvVar2 = vStack_30;
  }
  return iVar1 == 0;
}

Assistant:

bool CLineCount::createThread(int thread_number)
{
	LCTHREADCONTEXT * ctx = new LCTHREADCONTEXT;
	ctx->m_this = this;
	ctx->thread_number = thread_number;
#ifdef _WIN32
	HANDLE hThread = CreateThread(NULL, 0, threadProc, ctx, 0, NULL);
	if(!hThread)
	{
		return false;
	}
#else
	pthread_t hThread;
	int ret = pthread_create(&hThread, NULL, threadProc, ctx);
	if (ret != 0)
	{
		return false;
	}
#endif
	m_threads[thread_number] = hThread;
	return true;
}